

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_world_east(parser *p)

{
  int iVar1;
  long lVar2;
  wchar_t wVar3;
  errr eVar4;
  parser_error pVar5;
  char *pcVar6;
  void *pvVar7;
  wchar_t i;
  locality local_2c;
  
  pcVar6 = parser_getsym(p,"locality");
  wVar3 = parser_getint(p,"depth");
  pvVar7 = parser_priv(p);
  lVar2 = *(long *)((long)pvVar7 + 0x18);
  iVar1 = *(int *)((long)pvVar7 + 0x10);
  eVar4 = grab_name("locality",pcVar6,localities,0x27,(int *)&local_2c);
  pVar5 = PARSE_ERROR_INVALID_LOCALITY;
  if (eVar4 == 0) {
    pcVar6 = locality_name(local_2c);
    if (wVar3 == L'\0') {
      pcVar6 = format("%s Town",pcVar6);
    }
    else {
      pcVar6 = format("%s %d",pcVar6,(ulong)(uint)wVar3);
    }
    pcVar6 = string_make(pcVar6);
    *(char **)(lVar2 + (long)iVar1 * 0x50 + -0x30) = pcVar6;
    pVar5 = PARSE_ERROR_NONE;
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_world_east(struct parser *p) {
	const char *l_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	struct level_map *map = parser_priv(p);
	struct level *lev = &map->levels[map->num_levels - 1];
	int i;

	if (grab_name("locality", l_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	if (depth)
		lev->east = string_make(format("%s %d", locality_name(i), depth));
	else
		lev->east = string_make(format("%s Town", locality_name(i)));

	return PARSE_ERROR_NONE;
}